

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.hpp
# Opt level: O2

void njoy::tools::disco::Record<>::
     read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *iter,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *end)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = iter->_M_current;
  while (pcVar2 != end->_M_current) {
    bVar1 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
    if ((bVar1) || (*iter->_M_current == -1)) break;
    pcVar2 = iter->_M_current + 1;
    iter->_M_current = pcVar2;
  }
  bVar1 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
  iter->_M_current = iter->_M_current + (iter->_M_current != end->_M_current && bVar1);
  return;
}

Assistant:

static void read( Iterator& iter, const Iterator& end ) {

    while ( iter != end && ! ( isNewLine( iter )|| isEndOfFile( iter ) ) ) {

      ++iter;
    }
    std::advance( iter, isNewLine( iter ) && iter != end );
  }